

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DockBuilderDockWindow(char *window_name,ImGuiID node_id)

{
  ImGuiID key;
  ImGuiWindow *window;
  ImGuiWindowSettings *pIVar1;
  
  key = ImHashStr(window_name,0,0);
  window = (ImGuiWindow *)ImGuiStorage::GetVoidPtr(&GImGui->WindowsById,key);
  if (window == (ImGuiWindow *)0x0) {
    pIVar1 = FindWindowSettings(key);
    if (pIVar1 == (ImGuiWindowSettings *)0x0) {
      pIVar1 = CreateNewWindowSettings(window_name);
    }
    pIVar1->DockId = node_id;
    pIVar1->DockOrder = -1;
  }
  else {
    SetWindowDock(window,node_id,1);
    window->DockOrder = -1;
  }
  return;
}

Assistant:

void ImGui::DockBuilderDockWindow(const char* window_name, ImGuiID node_id)
{
    // We don't preserve relative order of multiple docked windows (by clearing DockOrder back to -1)
    ImGuiID window_id = ImHashStr(window_name);
    if (ImGuiWindow* window = FindWindowByID(window_id))
    {
        // Apply to created window
        SetWindowDock(window, node_id, ImGuiCond_Always);
        window->DockOrder = -1;
    }
    else
    {
        // Apply to settings
        ImGuiWindowSettings* settings = FindWindowSettings(window_id);
        if (settings == NULL)
            settings = CreateNewWindowSettings(window_name);
        settings->DockId = node_id;
        settings->DockOrder = -1;
    }
}